

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

LineBufferTask_conflict1 *
Imf_2_5::anon_unknown_6::newLineBufferTask
          (TaskGroup *group,Data *ifd,int number,int scanLineMin,int scanLineMax)

{
  LineBuffer *this;
  int *piVar1;
  LineBufferTask_conflict1 *pLVar2;
  uint in_EDX;
  long in_RSI;
  void *__stat_loc;
  exception *e;
  LineBuffer *lineBuffer;
  Int64 *in_stack_00000518;
  Int64 *in_stack_00000520;
  char **in_stack_00000528;
  int in_stack_00000534;
  Data *in_stack_00000538;
  InputStreamMutex *in_stack_00000540;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Data *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_18;
  uint local_14;
  long local_10;
  
  __stat_loc = (void *)(ulong)in_EDX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  this = DeepScanLineInputFile::Data::getLineBuffer
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  LineBuffer::wait(this,__stat_loc);
  if (this->scanLineMax != local_14) {
    *(uint *)&this->endOfLineBufferData =
         *(int *)(local_10 + 0xdc) + local_14 * *(int *)(local_10 + 0x168);
    *(int *)((long)&this->endOfLineBufferData + 4) =
         *(int *)&this->endOfLineBufferData + -1 + *(int *)(local_10 + 0x168);
    this->scanLineMax = local_14;
    (this->buffer)._size = 0;
    readPixelData(in_stack_00000540,in_stack_00000538,in_stack_00000534,in_stack_00000528,
                  in_stack_00000520,in_stack_00000518);
  }
  piVar1 = std::max<int>((int *)&this->endOfLineBufferData,&local_18);
  local_18 = *piVar1;
  piVar1 = std::min<int>((int *)((long)&this->endOfLineBufferData + 4),
                         (int *)&stack0xffffffffffffffe4);
  iVar3 = *piVar1;
  pLVar2 = (LineBufferTask_conflict1 *)operator_new(0x28);
  LineBufferTask::LineBufferTask
            ((LineBufferTask_conflict1 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),(TaskGroup *)this
             ,in_stack_ffffffffffffffd0,
             (LineBuffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  return pLVar2;
}

Assistant:

LineBufferTask *
newLineBufferTask
    (TaskGroup *group,
     DeepScanLineInputFile::Data *ifd,
     int number,
     int scanLineMin,
     int scanLineMax)
{
    //
    // Wait for a line buffer to become available, fill the line
    // buffer with raw data from the file if necessary, and create
    // a new LineBufferTask whose execute() method will uncompress
    // the contents of the buffer and copy the pixels into the
    // frame buffer.
    //

    LineBuffer *lineBuffer = ifd->getLineBuffer (number);

    try
    {
        lineBuffer->wait ();

        if (lineBuffer->number != number)
        {
            lineBuffer->minY = ifd->minY + number * ifd->linesInBuffer;
            lineBuffer->maxY = lineBuffer->minY + ifd->linesInBuffer - 1;

            lineBuffer->number = number;
            lineBuffer->uncompressedData = 0;

            readPixelData (ifd->_streamData, ifd, lineBuffer->minY,
                           lineBuffer->buffer,
                           lineBuffer->packedDataSize,
                           lineBuffer->unpackedDataSize);
        }
    }
    catch (std::exception &e)
    {
        if (!lineBuffer->hasException)
        {
            lineBuffer->exception = e.what();
            lineBuffer->hasException = true;
        }
        lineBuffer->number = -1;
        lineBuffer->post();
        throw;
    }
    catch (...)
    {
        //
        // Reading from the file caused an exception.
        // Signal that the line buffer is free, and
        // re-throw the exception.
        //

        lineBuffer->exception = "unrecognized exception";
        lineBuffer->hasException = true;
        lineBuffer->number = -1;
        lineBuffer->post();
        throw;
    }

    scanLineMin = max (lineBuffer->minY, scanLineMin);
    scanLineMax = min (lineBuffer->maxY, scanLineMax);

    return new LineBufferTask (group, ifd, lineBuffer,
                               scanLineMin, scanLineMax);
}